

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:335:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:335:17)>
            *this)

{
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  undefined1 local_d8 [96];
  Own<capnp::ResponseHook,_std::nullptr_t> local_78;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_68;
  Maybe<capnp::MessageSize> local_30;
  
  local_30.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            (&local_68,&((this->f).env)->membraned,&local_30);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
          *)local_d8,(int)&local_68,__buf,in_RCX,in_R8D);
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
              *)(local_d8 + 0x30),local_d8);
  capnproto_test::capnp::test::TestMembrane::MakeThingResults::Reader::getThing
            (__return_storage_ptr__,(Reader *)(local_d8 + 0x30));
  Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&local_78);
  capnp::RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *)local_d8)
  ;
  Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_68.hook);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }